

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O3

void triangularToSquareHessian
               (HighsHessian *hessian,vector<int,_std::allocator<int>_> *start,
               vector<int,_std::allocator<int>_> *index,
               vector<double,_std::allocator<double>_> *value)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  uint *puVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  int iVar11;
  ulong __n;
  size_type __new_size;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> length;
  vector<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar3 = hessian->dim_;
  __n = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (start,1,(value_type_conflict2 *)&local_58);
  }
  else {
    iVar11 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[__n];
    std::vector<int,_std::allocator<int>_>::resize(start,__n + 1);
    __new_size = (size_type)(int)(iVar11 * 2 - uVar3);
    std::vector<int,_std::allocator<int>_>::resize(index,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(value,__new_size);
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_58,__n,&local_34);
    piVar5 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar13] + 1;
      uVar12 = uVar13 + 1;
      if (piVar5[uVar13] + 1 < piVar5[uVar13 + 1]) {
        lVar14 = (long)piVar5[uVar13] + 1;
        do {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar6[lVar14]] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar6[lVar14]] + 1;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < piVar5[uVar12]);
      }
      uVar13 = uVar12;
    } while (uVar12 != __n);
    piVar5 = (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    *piVar5 = 0;
    iVar11 = 0;
    uVar13 = 0;
    do {
      iVar11 = iVar11 + local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13];
      piVar5[uVar13 + 1] = iVar11;
      uVar13 = uVar13 + 1;
    } while (__n != uVar13);
    puVar7 = (uint *)(hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar6 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar9 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar12 = (ulong)*puVar7;
    uVar13 = 0;
    do {
      iVar11 = piVar5[uVar13];
      piVar8[iVar11] = piVar6[(int)uVar12];
      pdVar10[iVar11] = pdVar9[(int)uVar12];
      piVar5[uVar13] = piVar5[uVar13] + 1;
      uVar1 = uVar13 + 1;
      uVar12 = (ulong)puVar7[uVar13 + 1];
      if ((int)(puVar7[uVar13] + 1) < (int)puVar7[uVar13 + 1]) {
        lVar14 = (long)(int)puVar7[uVar13] + 1;
        do {
          iVar11 = piVar6[lVar14];
          iVar4 = piVar5[iVar11];
          piVar8[iVar4] = (int)uVar13;
          dVar2 = pdVar9[lVar14];
          pdVar10[iVar4] = dVar2;
          piVar5[iVar11] = piVar5[iVar11] + 1;
          iVar4 = piVar5[uVar13];
          piVar8[iVar4] = iVar11;
          pdVar10[iVar4] = dVar2;
          piVar5[uVar13] = piVar5[uVar13] + 1;
          lVar14 = lVar14 + 1;
          uVar12 = (ulong)(int)puVar7[uVar1];
        } while (lVar14 < (long)uVar12);
      }
      uVar13 = uVar1;
    } while (uVar1 != __n);
    *piVar5 = 0;
    iVar11 = 0;
    uVar13 = 0;
    do {
      iVar11 = iVar11 + local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13];
      piVar5[uVar13 + 1] = iVar11;
      uVar13 = uVar13 + 1;
    } while (__n != uVar13);
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void triangularToSquareHessian(const HighsHessian& hessian,
                               vector<HighsInt>& start, vector<HighsInt>& index,
                               vector<double>& value) {
  const HighsInt dim = hessian.dim_;
  if (dim <= 0) {
    start.assign(1, 0);
    return;
  }
  assert(hessian.format_ == HessianFormat::kTriangular);
  const HighsInt nnz = hessian.start_[dim];
  const HighsInt square_nnz = nnz + (nnz - dim);
  start.resize(dim + 1);
  index.resize(square_nnz);
  value.resize(square_nnz);
  vector<HighsInt> length;
  length.assign(dim, 0);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iRow = hessian.index_[hessian.start_[iCol]];
    assert(iRow == iCol);
    length[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      assert(iRow > iCol);
      length[iRow]++;
      length[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
  assert(square_nnz == start[dim]);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    HighsInt iRow = hessian.index_[iEl];
    HighsInt toEl = start[iCol];
    index[toEl] = iRow;
    value[toEl] = hessian.value_[iEl];
    start[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt toEl = start[iRow];
      index[toEl] = iCol;
      value[toEl] = hessian.value_[iEl];
      start[iRow]++;
      toEl = start[iCol];
      index[toEl] = iRow;
      value[toEl] = hessian.value_[iEl];
      start[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
}